

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  Mat *pMVar14;
  long lVar15;
  _func_int *p_Var16;
  Mat *pMVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  undefined8 *puVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong local_140;
  Mat local_108;
  _func_int **local_c0;
  ulong local_b8;
  uint local_ac;
  size_t local_a8;
  size_t local_a0;
  void *local_98;
  Mat *local_90;
  ulong local_88;
  ulong local_80;
  Option opt_pack1;
  
  local_108.w = bottom_blob->w;
  local_108.h = bottom_blob->h;
  iVar7 = bottom_blob->d;
  uVar6 = bottom_blob->c;
  local_108.d = bottom_blob->d;
  local_108.c = bottom_blob->c;
  local_108.elemsize = bottom_blob->elemsize;
  local_108.elempack = bottom_blob->elempack;
  local_108.dims = bottom_blob->dims;
  if (local_108.elempack == 8) {
    switch(local_108.dims) {
    case 1:
      p_Var16 = this->_vptr_Padding_x86[-3];
      uVar6 = *(uint *)(&this->field_0xd8 + (long)p_Var16) + local_108.w * 8 +
              *(int *)(&this->field_0xdc + (long)p_Var16);
      bVar29 = (uVar6 & 7) == 0;
      if ((bVar29 && (*(uint *)(&this->field_0xd8 + (long)p_Var16) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var16) == 0)) {
        Mat::create(top_blob,(int)uVar6 >> 3,(local_108.elemsize >> 3) << bVar29 * '\x03',8,
                    opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var16 = this->_vptr_Padding_x86[-3];
          uVar8 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var16);
          iVar7 = *(int *)(&this->field_0xd8 + (long)p_Var16);
          iVar13 = iVar7 + 7;
          if (-1 < iVar7) {
            iVar13 = iVar7;
          }
          iVar7 = *(int *)(&this->field_0xdc + (long)p_Var16);
          iVar5 = iVar7 + 7;
          if (-1 < iVar7) {
            iVar5 = iVar7;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                     iVar13 >> 3,iVar5 >> 3,
                     uVar8 << 0x38 | uVar8 << 0x30 | uVar8 << 0x28 |
                     uVar8 << 0x20 | uVar8 << 0x18 | uVar8 << 0x10 | uVar8 << 8 | uVar8);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      p_Var16 = this->_vptr_Padding_x86[-3];
      uVar6 = *(uint *)(&this->field_0xd0 + (long)p_Var16) + local_108.h * 8 +
              *(int *)(&this->field_0xd4 + (long)p_Var16);
      bVar29 = (uVar6 & 7) == 0;
      if ((bVar29 && (*(uint *)(&this->field_0xd0 + (long)p_Var16) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var16) == 0)) {
        Mat::create(top_blob,local_108.w + *(int *)(&this->field_0xd8 + (long)p_Var16) +
                             *(int *)(&this->field_0xdc + (long)p_Var16),(int)uVar6 >> 3,
                    (local_108.elemsize >> 3) << bVar29 * '\x03',8,opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var16 = this->_vptr_Padding_x86[-3];
          uVar8 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var16);
          iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var16);
          iVar13 = *(int *)(&this->field_0xd4 + (long)p_Var16);
          iVar5 = iVar7 + 7;
          if (-1 < iVar7) {
            iVar5 = iVar7;
          }
          iVar7 = iVar13 + 7;
          if (-1 < iVar13) {
            iVar7 = iVar13;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                     iVar5 >> 3,iVar7 >> 3,*(int *)(&this->field_0xd8 + (long)p_Var16),
                     *(int *)(&this->field_0xdc + (long)p_Var16),
                     uVar8 << 0x38 | uVar8 << 0x30 | uVar8 << 0x28 |
                     uVar8 << 0x20 | uVar8 << 0x18 | uVar8 << 0x10 | uVar8 << 8 | uVar8);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      p_Var16 = this->_vptr_Padding_x86[-3];
      uVar9 = *(uint *)(&this->field_0xe8 + (long)p_Var16) + uVar6 * 8 +
              *(int *)(&this->field_0xec + (long)p_Var16);
      bVar29 = (uVar9 & 7) == 0;
      if (bVar29 && (*(uint *)(&this->field_0xe8 + (long)p_Var16) & 7) == 0) {
        if ((uVar9 == uVar6 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var16) == 0)) {
          uVar9 = (int)uVar9 >> 3;
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var16) + local_108.w +
                               *(int *)(&this->field_0xdc + (long)p_Var16),
                      *(int *)(&this->field_0xd0 + (long)p_Var16) + local_108.h +
                      *(int *)(&this->field_0xd4 + (long)p_Var16),uVar9,
                      (local_108.elemsize >> 3) << bVar29 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_c0 = this->_vptr_Padding_x86;
            iVar7 = *(int *)(&this->field_0xe8 + (long)local_c0[-3]);
            iVar13 = iVar7 + 7;
            if (-1 < iVar7) {
              iVar13 = iVar7;
            }
            if ((int)uVar9 < 1) {
              return 0;
            }
            uVar22 = -(iVar13 >> 3);
            uVar8 = (ulong)uVar9;
            uVar28 = 0;
            auVar34 = _DAT_003132e0;
            local_ac = uVar22;
            local_88 = uVar8;
            do {
              local_b8 = (ulong)uVar22;
              pvVar3 = top_blob->data;
              p_Var16 = local_c0[-3];
              uVar11 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var16);
              uVar11 = uVar11 << 0x38 | uVar11 << 0x30 | uVar11 << 0x28 |
                       uVar11 << 0x20 | uVar11 << 0x18 | uVar11 << 0x10 | uVar11 << 8 | uVar11;
              uVar9 = local_ac + (int)uVar28;
              if ((int)uVar9 < 0 || (int)uVar6 <= (int)uVar9) {
                iVar7 = 1;
                if (top_blob->dims != 3) {
                  iVar7 = top_blob->d;
                }
                uVar9 = top_blob->w * top_blob->h * iVar7;
                if (0 < (int)uVar9) {
                  lVar15 = (ulong)uVar9 - 1;
                  auVar30._8_4_ = (int)lVar15;
                  auVar30._0_8_ = lVar15;
                  auVar30._12_4_ = (int)((ulong)lVar15 >> 0x20);
                  lVar15 = top_blob->cstep * top_blob->elemsize * uVar28;
                  auVar30 = auVar30 ^ auVar34;
                  uVar10 = 0;
                  auVar33 = _DAT_00313360;
                  do {
                    auVar32 = auVar33 ^ auVar34;
                    if ((bool)(~(auVar30._4_4_ < auVar32._4_4_ ||
                                auVar30._0_4_ < auVar32._0_4_ && auVar32._4_4_ == auVar30._4_4_) & 1
                              )) {
                      *(ulong *)((long)pvVar3 + uVar10 * 8 + lVar15) = uVar11;
                    }
                    if (auVar32._12_4_ <= auVar30._12_4_ &&
                        (auVar32._8_4_ <= auVar30._8_4_ || auVar32._12_4_ != auVar30._12_4_)) {
                      *(ulong *)((long)pvVar3 + uVar10 * 8 + lVar15 + 8) = uVar11;
                    }
                    uVar10 = uVar10 + 2;
                    lVar20 = auVar33._8_8_;
                    auVar33._0_8_ = auVar33._0_8_ + 2;
                    auVar33._8_8_ = lVar20 + 2;
                  } while ((uVar9 + 1 & 0xfffffffe) != uVar10);
                }
              }
              else {
                bVar29 = bottom_blob->dims == 3;
                local_108.c = 1;
                if (!bVar29) {
                  local_108.c = bottom_blob->d;
                }
                pMVar14 = (Mat *)((long)pvVar3 + top_blob->cstep * uVar28 * top_blob->elemsize);
                iVar7 = bottom_blob->w;
                lVar15 = (long)iVar7;
                iVar13 = bottom_blob->h;
                local_108.dims = bVar29 ^ 3;
                local_98 = bottom_blob->data;
                local_108.elemsize = bottom_blob->elemsize;
                local_a0 = bottom_blob->cstep;
                puVar18 = (undefined8 *)(uVar9 * local_a0 * local_108.elemsize + (long)local_98);
                local_108.elempack = bottom_blob->elempack;
                local_108.allocator = bottom_blob->allocator;
                local_108.refcount = (int *)0x0;
                local_108.cstep = iVar13 * lVar15;
                local_108.d = 1;
                iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var16);
                local_a8 = local_108.elemsize;
                if (iVar5 == 0) {
                  local_108.data = puVar18;
                  local_108.w = iVar7;
                  local_108.h = iVar13;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&local_108,pMVar14,(Mat *)(ulong)(uint)top_blob->w,
                             *(int *)(&this->field_0xd0 + (long)p_Var16),
                             *(int *)(&this->field_0xd4 + (long)p_Var16),
                             *(int *)(&this->field_0xd8 + (long)p_Var16),
                             *(int *)(&this->field_0xdc + (long)p_Var16),uVar11);
                  local_c0 = this->_vptr_Padding_x86;
                  p_Var16 = local_c0[-3];
                  iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var16);
                  auVar34 = _DAT_003132e0;
                }
                if (iVar5 == 1) {
                  iVar5 = *(int *)(&this->field_0xd0 + (long)p_Var16);
                  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var16);
                  iVar12 = *(int *)(&this->field_0xd8 + (long)p_Var16);
                  iVar2 = *(int *)(&this->field_0xdc + (long)p_Var16);
                  pMVar17 = pMVar14;
                  if (0 < iVar5) {
                    lVar20 = local_a0 * local_a8 * local_b8;
                    iVar21 = 0;
                    do {
                      if (0 < iVar12) {
                        pvVar3 = (void *)*puVar18;
                        iVar25 = iVar12;
                        do {
                          pMVar17->data = pvVar3;
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          iVar25 = iVar25 + -1;
                        } while (iVar25 != 0);
                      }
                      puVar19 = puVar18;
                      if (0 < iVar7) {
                        lVar24 = 0;
                        lVar26 = 0;
                        do {
                          (&pMVar17->data)[lVar26] =
                               *(void **)((long)local_98 + lVar26 * 8 + lVar20);
                          lVar26 = lVar26 + 1;
                          lVar24 = lVar24 + -8;
                        } while (iVar7 != (int)lVar26);
                        pMVar17 = (Mat *)((long)pMVar17 - lVar24);
                        puVar19 = (undefined8 *)((long)local_98 + (lVar20 - lVar24));
                      }
                      if (0 < iVar2) {
                        pvVar3 = (void *)puVar19[-1];
                        iVar25 = iVar2;
                        do {
                          pMVar17->data = pvVar3;
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          iVar25 = iVar25 + -1;
                        } while (iVar25 != 0);
                      }
                      iVar21 = iVar21 + 1;
                    } while (iVar21 != iVar5);
                  }
                  puVar19 = puVar18;
                  if (0 < iVar13) {
                    iVar5 = 0;
                    do {
                      if (0 < iVar12) {
                        pvVar3 = (void *)*puVar19;
                        iVar21 = iVar12;
                        do {
                          pMVar17->data = pvVar3;
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          iVar21 = iVar21 + -1;
                        } while (iVar21 != 0);
                      }
                      if (0 < iVar7) {
                        lVar20 = 0;
                        lVar24 = 0;
                        do {
                          (&pMVar17->data)[lVar24] = (void *)puVar19[lVar24];
                          lVar24 = lVar24 + 1;
                          lVar20 = lVar20 + -8;
                        } while (iVar7 != (int)lVar24);
                        pMVar17 = (Mat *)((long)pMVar17 - lVar20);
                        puVar19 = (undefined8 *)((long)puVar19 - lVar20);
                      }
                      if (0 < iVar2) {
                        pvVar3 = (void *)puVar19[-1];
                        iVar21 = iVar2;
                        do {
                          pMVar17->data = pvVar3;
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          iVar21 = iVar21 + -1;
                        } while (iVar21 != 0);
                      }
                      iVar5 = iVar5 + 1;
                    } while (iVar5 != iVar13);
                  }
                  if (0 < iVar1) {
                    puVar19 = puVar19 + -lVar15;
                    iVar5 = 0;
                    do {
                      if (0 < iVar12) {
                        pvVar3 = (void *)*puVar19;
                        iVar21 = iVar12;
                        do {
                          pMVar17->data = pvVar3;
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          iVar21 = iVar21 + -1;
                        } while (iVar21 != 0);
                      }
                      puVar23 = puVar19;
                      if (0 < iVar7) {
                        lVar20 = 0;
                        lVar24 = 0;
                        do {
                          (&pMVar17->data)[lVar24] = (void *)puVar19[lVar24];
                          lVar24 = lVar24 + 1;
                          lVar20 = lVar20 + -8;
                        } while (iVar7 != (int)lVar24);
                        pMVar17 = (Mat *)((long)pMVar17 - lVar20);
                        puVar23 = (undefined8 *)((long)puVar19 - lVar20);
                      }
                      if (0 < iVar2) {
                        pvVar3 = (void *)puVar23[-1];
                        iVar21 = iVar2;
                        do {
                          pMVar17->data = pvVar3;
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          iVar21 = iVar21 + -1;
                        } while (iVar21 != 0);
                      }
                      iVar5 = iVar5 + 1;
                    } while (iVar5 != iVar1);
                  }
                }
                p_Var16 = local_c0[-3];
                uVar8 = local_88;
                local_80 = uVar28;
                if (*(int *)(&this->field_0xe0 + (long)p_Var16) == 2) {
                  iVar5 = *(int *)(&this->field_0xd0 + (long)p_Var16);
                  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var16);
                  uVar9 = *(uint *)(&this->field_0xd8 + (long)p_Var16);
                  lVar24 = (long)(int)uVar9;
                  uVar10 = (ulong)uVar9;
                  uVar22 = *(uint *)(&this->field_0xdc + (long)p_Var16);
                  uVar11 = (ulong)uVar22;
                  lVar20 = (long)(iVar7 * iVar5);
                  if (iVar5 < 1) {
                    puVar18 = puVar18 + lVar20;
                  }
                  else {
                    lVar26 = local_a0 * local_a8 * local_b8;
                    lVar27 = lVar26 + lVar24 * 8 + lVar20 * 8 + (long)local_98;
                    puVar18 = (undefined8 *)(lVar26 + lVar20 * 8 + (long)local_98);
                    iVar12 = 0;
                    do {
                      if (0 < (int)uVar9) {
                        lVar20 = 0;
                        do {
                          pMVar14->data = *(void **)(lVar27 + lVar20 * 8);
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar20 = lVar20 + -1;
                        } while (-lVar20 != uVar10);
                      }
                      puVar19 = puVar18;
                      if (0 < iVar7) {
                        lVar26 = 0;
                        lVar20 = 0;
                        do {
                          (&pMVar14->data)[lVar20] = (void *)puVar18[lVar20];
                          lVar20 = lVar20 + 1;
                          lVar26 = lVar26 + -8;
                        } while (iVar7 != (int)lVar20);
                        pMVar14 = (Mat *)((long)pMVar14 - lVar26);
                        puVar19 = (undefined8 *)((long)puVar18 - lVar26);
                      }
                      if (0 < (int)uVar22) {
                        lVar20 = 0;
                        do {
                          pMVar14->data = (void *)puVar19[lVar20 + -2];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar20 = lVar20 + -1;
                        } while (-lVar20 != uVar11);
                      }
                      puVar18 = puVar18 + -lVar15;
                      iVar12 = iVar12 + 1;
                      lVar27 = lVar27 + lVar15 * -8;
                    } while (iVar12 != iVar5);
                  }
                  if (0 < iVar13) {
                    iVar5 = 0;
                    do {
                      if (0 < (int)uVar9) {
                        lVar20 = 0;
                        do {
                          pMVar14->data = (void *)puVar18[lVar24 + lVar20];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar20 = lVar20 + -1;
                        } while (-lVar20 != uVar10);
                      }
                      if (0 < iVar7) {
                        lVar26 = 0;
                        lVar20 = 0;
                        do {
                          (&pMVar14->data)[lVar20] = (void *)puVar18[lVar20];
                          lVar20 = lVar20 + 1;
                          lVar26 = lVar26 + -8;
                        } while (iVar7 != (int)lVar20);
                        pMVar14 = (Mat *)((long)pMVar14 - lVar26);
                        puVar18 = (undefined8 *)((long)puVar18 - lVar26);
                      }
                      if (0 < (int)uVar22) {
                        lVar20 = 0;
                        do {
                          pMVar14->data = (void *)puVar18[lVar20 + -2];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar20 = lVar20 + -1;
                        } while (-lVar20 != uVar11);
                      }
                      iVar5 = iVar5 + 1;
                    } while (iVar5 != iVar13);
                  }
                  if (0 < iVar1) {
                    puVar19 = puVar18 + -(long)(iVar7 * 2);
                    puVar18 = puVar18 + (lVar24 - iVar7 * 2);
                    iVar13 = 0;
                    do {
                      if (0 < (int)uVar9) {
                        lVar20 = 0;
                        do {
                          pMVar14->data = (void *)puVar18[lVar20];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar20 = lVar20 + -1;
                        } while (-lVar20 != uVar10);
                      }
                      puVar23 = puVar19;
                      if (0 < iVar7) {
                        lVar24 = 0;
                        lVar20 = 0;
                        do {
                          (&pMVar14->data)[lVar20] = (void *)puVar19[lVar20];
                          lVar20 = lVar20 + 1;
                          lVar24 = lVar24 + -8;
                        } while (iVar7 != (int)lVar20);
                        pMVar14 = (Mat *)((long)pMVar14 - lVar24);
                        puVar23 = (undefined8 *)((long)puVar19 - lVar24);
                      }
                      if (0 < (int)uVar22) {
                        lVar20 = 0;
                        do {
                          pMVar14->data = (void *)puVar23[lVar20 + -2];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar20 = lVar20 + -1;
                        } while (-lVar20 != uVar11);
                      }
                      puVar19 = puVar19 + -lVar15;
                      iVar13 = iVar13 + 1;
                      puVar18 = puVar18 + -lVar15;
                    } while (iVar13 != iVar1);
                  }
                }
              }
              uVar28 = uVar28 + 1;
              uVar22 = (int)local_b8 + 1;
            } while (uVar28 != uVar8);
            return 0;
          }
          return -100;
        }
      }
      break;
    case 4:
      p_Var16 = this->_vptr_Padding_x86[-3];
      if (*(int *)(&this->field_0xe0 + (long)p_Var16) == 0) {
        uVar9 = *(int *)(&this->field_0xe8 + (long)p_Var16) + iVar7 +
                *(int *)(&this->field_0xec + (long)p_Var16);
        Mat::create(top_blob,local_108.w + *(int *)(&this->field_0xd8 + (long)p_Var16) +
                             *(int *)(&this->field_0xdc + (long)p_Var16),
                    local_108.h + *(int *)(&this->field_0xd0 + (long)p_Var16) +
                    *(int *)(&this->field_0xd4 + (long)p_Var16),uVar9,uVar6,local_108.elemsize,8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if ((int)uVar6 < 1) {
            return 0;
          }
          local_140 = 0;
          auVar34 = _DAT_003132e0;
          local_90 = top_blob;
          do {
            if (0 < (int)uVar9) {
              uVar8 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86[-3]);
              uVar8 = uVar8 << 0x38 | uVar8 << 0x30 | uVar8 << 0x28 |
                      uVar8 << 0x20 | uVar8 << 0x18 | uVar8 << 0x10 | uVar8 << 8 | uVar8;
              uVar28 = 0;
              do {
                pMVar14 = (Mat *)(long)top_blob->w;
                pvVar3 = top_blob->data;
                sVar4 = top_blob->elemsize;
                lVar20 = top_blob->cstep * local_140;
                lVar15 = (long)top_blob->h * (long)pMVar14;
                p_Var16 = this->_vptr_Padding_x86[-3];
                uVar22 = (int)uVar28 - *(int *)(&this->field_0xe8 + (long)p_Var16);
                if ((int)uVar22 < 0 || iVar7 <= (int)uVar22) {
                  uVar22 = (uint)lVar15;
                  if (0 < (int)uVar22) {
                    lVar15 = (ulong)(uVar22 & 0x7fffffff) - 1;
                    auVar31._8_4_ = (int)lVar15;
                    auVar31._0_8_ = lVar15;
                    auVar31._12_4_ = (int)((ulong)lVar15 >> 0x20);
                    lVar15 = sVar4 * ((long)top_blob->h * uVar28 * (long)pMVar14 + lVar20);
                    auVar31 = auVar31 ^ auVar34;
                    uVar11 = 0;
                    auVar32 = _DAT_00313360;
                    do {
                      auVar33 = auVar32 ^ auVar34;
                      if ((bool)(~(auVar31._4_4_ < auVar33._4_4_ ||
                                  auVar31._0_4_ < auVar33._0_4_ && auVar33._4_4_ == auVar31._4_4_) &
                                1)) {
                        *(ulong *)((long)pvVar3 + uVar11 * 8 + lVar15) = uVar8;
                      }
                      if (auVar33._12_4_ <= auVar31._12_4_ &&
                          (auVar33._8_4_ <= auVar31._8_4_ || auVar33._12_4_ != auVar31._12_4_)) {
                        *(ulong *)((long)pvVar3 + uVar11 * 8 + lVar15 + 8) = uVar8;
                      }
                      uVar11 = uVar11 + 2;
                      lVar20 = auVar32._8_8_;
                      auVar32._0_8_ = auVar32._0_8_ + 2;
                      auVar32._8_8_ = lVar20 + 2;
                    } while ((uVar22 + 1 & 0xfffffffe) != uVar11);
                  }
                }
                else {
                  local_108.w = bottom_blob->w;
                  local_108.elemsize = bottom_blob->elemsize;
                  local_108.h = bottom_blob->h;
                  local_108.cstep = (long)local_108.h * (long)local_108.w;
                  local_108.elempack = bottom_blob->elempack;
                  local_108.data =
                       (void *)((long)bottom_blob->data +
                               local_108.elemsize * local_108.cstep * (ulong)uVar22 +
                               bottom_blob->cstep * local_140 * local_108.elemsize);
                  local_108.allocator = bottom_blob->allocator;
                  local_108.refcount = (int *)0x0;
                  local_108.dims = 2;
                  local_108.d = 1;
                  local_108.c = 1;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&local_108,
                             (Mat *)((long)pvVar3 + lVar15 * sVar4 * uVar28 + lVar20 * sVar4),
                             pMVar14,*(int *)(&this->field_0xd0 + (long)p_Var16),
                             *(int *)(&this->field_0xd4 + (long)p_Var16),
                             *(int *)(&this->field_0xd8 + (long)p_Var16),
                             *(int *)(&this->field_0xdc + (long)p_Var16),uVar8);
                  auVar34 = _DAT_003132e0;
                }
                uVar28 = uVar28 + 1;
                top_blob = local_90;
              } while (uVar28 != uVar9);
            }
            local_140 = local_140 + 1;
          } while (local_140 != uVar6);
          return 0;
        }
        return -100;
      }
    }
  }
  local_108.data = bottom_blob->data;
  local_108.refcount = bottom_blob->refcount;
  local_108.allocator = bottom_blob->allocator;
  local_108.cstep = bottom_blob->cstep;
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + 1;
    UNLOCK();
  }
  if (local_108.elempack != 1) {
    opt_pack1.lightmode = opt->lightmode;
    opt_pack1._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_pack1.num_threads = opt->num_threads;
    opt_pack1.workspace_allocator = opt->workspace_allocator;
    opt_pack1.openmp_blocktime = opt->openmp_blocktime;
    opt_pack1.use_winograd_convolution = opt->use_winograd_convolution;
    opt_pack1.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_pack1.use_int8_inference = opt->use_int8_inference;
    opt_pack1.use_vulkan_compute = opt->use_vulkan_compute;
    opt_pack1.use_bf16_storage = opt->use_bf16_storage;
    opt_pack1.use_fp16_packed = opt->use_fp16_packed;
    opt_pack1.use_fp16_storage = opt->use_fp16_storage;
    opt_pack1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_pack1.use_int8_packed = opt->use_int8_packed;
    opt_pack1.use_int8_storage = opt->use_int8_storage;
    opt_pack1.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_pack1.use_packing_layout = opt->use_packing_layout;
    opt_pack1.use_shader_pack8 = opt->use_shader_pack8;
    opt_pack1.use_subgroup_basic = opt->use_subgroup_basic;
    opt_pack1.use_subgroup_vote = opt->use_subgroup_vote;
    opt_pack1.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_pack1.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_pack1.use_image_storage = opt->use_image_storage;
    opt_pack1.use_tensor_storage = opt->use_tensor_storage;
    opt_pack1.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_pack1.flush_denormals = opt->flush_denormals;
    opt_pack1.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_pack1.use_reserved_1 = opt->use_reserved_1;
    opt_pack1.use_reserved_2 = opt->use_reserved_2;
    opt_pack1.use_reserved_3 = opt->use_reserved_3;
    opt_pack1.use_reserved_4 = opt->use_reserved_4;
    opt_pack1.use_reserved_5 = opt->use_reserved_5;
    opt_pack1.use_reserved_6 = opt->use_reserved_6;
    opt_pack1.use_reserved_7 = opt->use_reserved_7;
    opt_pack1.use_reserved_8 = opt->use_reserved_8;
    opt_pack1.use_reserved_9 = opt->use_reserved_9;
    opt_pack1.use_reserved_10 = opt->use_reserved_10;
    opt_pack1.use_reserved_11 = opt->use_reserved_11;
    opt_pack1.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,&local_108,1,&opt_pack1);
  }
  iVar7 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),
                           &local_108,top_blob,opt);
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + -1;
    UNLOCK();
    if (*local_108.refcount == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar7;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}